

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sysbvm_tuple_t sysbvm_filesystem_absolute(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  char *__name;
  char *cstring;
  sysbvm_tuple_t sVar1;
  
  if ((((path & 0xf) == 0 && path != 0) && ((*(uint *)(path + 8) & 0x300) == 0x200)) &&
     (((path & 0xf) != 0 ||
      ((((*(uint *)(path + 8) & 0x300) != 0x200 || (*(int *)(path + 0xc) == 0)) ||
       (*(char *)(path + 0x10) != '/')))))) {
    __name = sysbvm_tuple_bytesToCString(path);
    cstring = realpath(__name,(char *)0x0);
    free(__name);
    if (cstring == (char *)0x0) {
      sVar1 = sysbvm_filesystem_getWorkingDirectory(context);
      sVar1 = sysbvm_filesystem_joinPath(context,sVar1,path);
      return sVar1;
    }
    path = sysbvm_string_createWithCString(context,cstring);
    free(cstring);
  }
  return path;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_absolute(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    (void)context;
    if(!sysbvm_tuple_isBytes(path) || sysbvm_filesystem_isAbsolute(path))
        return path;

#ifdef _WIN32
    return path;
#else
    char *pathCString = sysbvm_tuple_bytesToCString(path);
    char *absolutePath = realpath(pathCString, NULL);
    free(pathCString);
    if(!absolutePath)
        return sysbvm_filesystem_joinPath(context, sysbvm_filesystem_getWorkingDirectory(context), path);

    sysbvm_tuple_t result = sysbvm_string_createWithCString(context, absolutePath);
    free(absolutePath);
    return result;
#endif
}